

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O2

void strscan_double(uint64_t x,TValue *o,int32_t ex2,int32_t neg)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  lua_Number __x;
  
  if (x != 0 && ex2 < -0x432) {
    lVar1 = 0x3f;
    if (x != 0) {
      for (; x >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    if ((int)lVar1 + ex2 + 0x433U < 0x35) {
      bVar2 = (byte)(-ex2 - 0x433U);
      if ((x >> ((ulong)(-ex2 - 0x433U) & 0x3f) & 1) != 0) {
        uVar4 = 2L << (bVar2 & 0x3f);
        uVar3 = ((1L << (bVar2 & 0x3f)) + uVar4) - 1 & x;
        if (uVar3 != 0) {
          uVar3 = uVar4;
        }
        x = x + uVar3;
      }
      x = x & -2L << (bVar2 & 0x3f);
    }
  }
  __x = (lua_Number)(long)x;
  if (neg != 0) {
    __x = -__x;
  }
  if (ex2 != 0) {
    __x = ldexp(__x,ex2);
  }
  o->n = __x;
  return;
}

Assistant:

static void strscan_double(uint64_t x, TValue *o, int32_t ex2, int32_t neg)
{
  double n;

  /* Avoid double rounding for denormals. */
  if (LJ_UNLIKELY(ex2 <= -1075 && x != 0)) {
    /* NYI: all of this generates way too much code on 32 bit CPUs. */
#if defined(__GNUC__) && LJ_64
    int32_t b = (int32_t)(__builtin_clzll(x)^63);
#else
    int32_t b = (x>>32) ? 32+(int32_t)lj_fls((uint32_t)(x>>32)) :
			  (int32_t)lj_fls((uint32_t)x);
#endif
    if ((int32_t)b + ex2 <= -1023 && (int32_t)b + ex2 >= -1075) {
      uint64_t rb = (uint64_t)1 << (-1075-ex2);
      if ((x & rb) && ((x & (rb+rb+rb-1)))) x += rb+rb;
      x = (x & ~(rb+rb-1));
    }
  }

  /* Convert to double using a signed int64_t conversion, then rescale. */
  lua_assert((int64_t)x >= 0);
  n = (double)(int64_t)x;
  if (neg) n = -n;
  if (ex2) n = ldexp(n, ex2);
  o->n = n;
}